

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::BlockEnd(w3Interp *this)

{
  w3StackValue *pwVar1;
  bool bVar2;
  ulong local_68;
  size_t i;
  w3StackValue *p;
  string local_40;
  size_t local_20;
  size_t j;
  size_t s;
  w3Interp *this_local;
  
  s = (size_t)this;
  local_20 = w3Stack::size(&this->super_w3Stack);
  j = local_20;
  if (local_20 == 0) {
    StringFormat_abi_cxx11_(&local_40,"%lX",0);
    AssertFailedFormat("s > 0",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pwVar1 = w3Stack::front(&this->super_w3Stack);
  while( true ) {
    bVar2 = false;
    if (local_20 != 0) {
      bVar2 = pwVar1[local_20 - 1].tag == Tag_Value;
    }
    if (!bVar2) break;
    local_20 = local_20 - 1;
  }
  if ((local_20 == 0) ||
     ((pwVar1[local_20 - 1].tag != Tag_Label && (pwVar1[local_20 - 1].tag != Tag_Frame)))) {
    AssertFailed("j > 0 && (p [j - 1].tag == Tag_Label || p [j - 1].tag == Tag_Frame)");
  }
  for (local_68 = local_20 - 1; local_68 < j; local_68 = local_68 + 1) {
    memcpy(pwVar1 + local_68,pwVar1 + local_68 + 1,0x30);
  }
  w3Stack::resize(&this->super_w3Stack,j - 1);
  return;
}

Assistant:

INTERP (BlockEnd)
{
    // Pop values until label is found.
    // Pop label.
    // Repush values.
    //
    // Alternatively, look for label,
    // and shift values down.
    //
    // Alternatively, something much faster.

    const size_t s = size ();
    size_t j = s;

    AssertFormat (s > 0, ("%" FORMAT_SIZE "X", s));

    // Skip any number of values until one label is found,

    w3StackValue* p = &front ();

    while (j > 0 && p [j - 1].tag == Tag_Value)
        --j;

    // FIXME mark earlier if end of block or function
    // FIXME And then assert?

    Assert (j > 0 && (p [j - 1].tag == Tag_Label || p [j - 1].tag == Tag_Frame));

    for (size_t i = j - 1; i < s; ++i)
        p [i] = p [i + 1];

    resize (s - 1);
}